

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_namelist.cc
# Opt level: O1

MissingListType * ctemplate::TemplateNamelist::GetMissingList_abi_cxx11_(bool refresh)

{
  pointer pbVar1;
  pointer pbVar2;
  long lVar3;
  int iVar4;
  NameListType *pNVar5;
  TemplateCache *this;
  ostream *poVar6;
  ulong uVar7;
  _Hash_node_base *p_Var8;
  string path;
  char *local_70;
  long local_68;
  char local_60 [16];
  string local_50;
  
  if (missing_list__abi_cxx11_ ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    missing_list__abi_cxx11_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)operator_new(0x18);
    (missing_list__abi_cxx11_->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (missing_list__abi_cxx11_->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (missing_list__abi_cxx11_->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else if (!refresh) goto LAB_0012d920;
  pNVar5 = GetList_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(missing_list__abi_cxx11_);
  p_Var8 = (pNVar5->_M_h)._M_before_begin._M_nxt;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      this = default_template_cache();
      TemplateCache::FindTemplateFilename(&local_50,this,(value_type *)(p_Var8 + 1));
      if ((local_50._M_string_length == 0) ||
         (iVar4 = access(local_50._M_dataplus._M_p,4), iVar4 != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(missing_list__abi_cxx11_,(value_type *)(p_Var8 + 1));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Template file missing: ",0x17);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)p_Var8[1]._M_nxt,(long)p_Var8[2]._M_nxt);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," at path: ",10);
        local_70 = local_60;
        if (local_50._M_string_length == 0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"(empty path)","");
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_50._M_dataplus._M_p,
                     local_50._M_dataplus._M_p + local_50._M_string_length);
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_70,local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
LAB_0012d920:
  pbVar1 = (missing_list__abi_cxx11_->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (missing_list__abi_cxx11_->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    uVar7 = (long)pbVar2 - (long)pbVar1 >> 5;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar1,pbVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar1,pbVar2);
  }
  return missing_list__abi_cxx11_;
}

Assistant:

const TemplateNamelist::MissingListType& TemplateNamelist::GetMissingList(
    bool refresh) {
  if (!missing_list_) {
    missing_list_ = new MissingListType;
    refresh = true;  // always refresh the first time
  }

  if (refresh) {
    const NameListType& the_list = TemplateNamelist::GetList();
    missing_list_->clear();

    for (NameListType::const_iterator iter = the_list.begin();
         iter != the_list.end();
         ++iter) {
      const string path = Template::FindTemplateFilename(*iter);
      if (path.empty() || !File::Readable(path.c_str())) {
        missing_list_->push_back(*iter);
        LOG(ERROR) << "Template file missing: " << *iter
                   << " at path: " << (path.empty() ? "(empty path)" : path)
                   << "\n";
      }
    }
  }

  sort(missing_list_->begin(), missing_list_->end());
  return *missing_list_;
}